

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O0

void Rnm_ManJustify_rec(Rnm_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect)

{
  Rnm_Obj_t RVar1;
  int iVar2;
  uint uVar3;
  Rnm_Obj_t *pRVar4;
  Gia_Obj_t *pGVar5;
  Rnm_Obj_t *pRVar6;
  Rnm_Obj_t *pRVar7;
  Rnm_Obj_t *pRnm1;
  Rnm_Obj_t *pRnm0;
  int i;
  Rnm_Obj_t *pRnm;
  Vec_Int_t *vSelect_local;
  int f_local;
  Gia_Obj_t *pObj_local;
  Rnm_Man_t *p_local;
  
  pRVar4 = Rnm_ManObj(p,pObj,f);
  if (((uint)*pRVar4 >> 1 & 1) == 0) {
    if (p->fPropFanout == 0) {
      *pRVar4 = (Rnm_Obj_t)((uint)*pRVar4 & 0xfffffffd | 2);
      pRVar6 = Rnm_ManObj(p,pObj,0);
      if (((uint)*pRVar6 >> 2 & 1) == 0) {
        pRVar6 = Rnm_ManObj(p,pObj,0);
        *pRVar6 = (Rnm_Obj_t)((uint)*pRVar6 & 0xfffffffb | 4);
        p->nVisited = p->nVisited + 1;
      }
    }
    else {
      Rnm_ManJustifyPropFanout_rec(p,pObj,f,vSelect);
    }
    if (((uint)*pRVar4 >> 3 & 1) == 0) {
      iVar2 = Gia_ObjIsPi(p->pGia,pObj);
      if ((iVar2 == 0) && (iVar2 = Gia_ObjIsConst0(pObj), iVar2 == 0)) {
        iVar2 = Gia_ObjIsRo(p->pGia,pObj);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsAnd(pObj);
          if (iVar2 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                          ,0x25d,
                          "void Rnm_ManJustify_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
          }
          pGVar5 = Gia_ObjFanin0(pObj);
          pRVar6 = Rnm_ManObj(p,pGVar5,f);
          pGVar5 = Gia_ObjFanin1(pObj);
          pRVar7 = Rnm_ManObj(p,pGVar5,f);
          if (((uint)*pRVar4 & 1) == 1) {
            if (((uint)*pRVar6 >> 4 & 0xffffff) != 0) {
              pGVar5 = Gia_ObjFanin0(pObj);
              Rnm_ManJustify_rec(p,pGVar5,f,vSelect);
            }
            if (((uint)*pRVar7 >> 4 & 0xffffff) != 0) {
              pGVar5 = Gia_ObjFanin1(pObj);
              Rnm_ManJustify_rec(p,pGVar5,f,vSelect);
            }
          }
          else {
            RVar1 = *pRVar6;
            uVar3 = Gia_ObjFaninC0(pObj);
            if ((((uint)RVar1 & 1) == uVar3) &&
               (RVar1 = *pRVar7, uVar3 = Gia_ObjFaninC1(pObj), ((uint)RVar1 & 1) == uVar3)) {
              if (((uint)*pRVar7 >> 4 & 0xffffff) < ((uint)*pRVar6 >> 4 & 0xffffff)) {
                if (((uint)*pRVar7 >> 4 & 0xffffff) != 0) {
                  pGVar5 = Gia_ObjFanin1(pObj);
                  Rnm_ManJustify_rec(p,pGVar5,f,vSelect);
                }
              }
              else if (((uint)*pRVar6 >> 4 & 0xffffff) != 0) {
                pGVar5 = Gia_ObjFanin0(pObj);
                Rnm_ManJustify_rec(p,pGVar5,f,vSelect);
              }
            }
            else {
              RVar1 = *pRVar6;
              uVar3 = Gia_ObjFaninC0(pObj);
              if (((uint)RVar1 & 1) == uVar3) {
                if (((uint)*pRVar6 >> 4 & 0xffffff) != 0) {
                  pGVar5 = Gia_ObjFanin0(pObj);
                  Rnm_ManJustify_rec(p,pGVar5,f,vSelect);
                }
              }
              else {
                RVar1 = *pRVar7;
                uVar3 = Gia_ObjFaninC1(pObj);
                if (((uint)RVar1 & 1) != uVar3) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                                ,0x25a,
                                "void Rnm_ManJustify_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)"
                               );
                }
                if (((uint)*pRVar7 >> 4 & 0xffffff) != 0) {
                  pGVar5 = Gia_ObjFanin1(pObj);
                  Rnm_ManJustify_rec(p,pGVar5,f,vSelect);
                }
              }
            }
          }
        }
        else if (0 < f) {
          pGVar5 = Gia_ObjRoToRi(p->pGia,pObj);
          pGVar5 = Gia_ObjFanin0(pGVar5);
          Rnm_ManJustify_rec(p,pGVar5,f + -1,vSelect);
        }
      }
    }
    else {
      if (((uint)*pRVar4 >> 4 & 0xffffff) == 0) {
        __assert_fail("(int)pRnm->Prio > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                      ,0x21f,"void Rnm_ManJustify_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
      }
      if (p->fPropFanout == 0) {
        iVar2 = Gia_ObjId(p->pGia,pObj);
        Vec_IntPush(vSelect,iVar2);
      }
      else {
        for (pRnm0._4_4_ = p->pCex->iFrame; -1 < pRnm0._4_4_; pRnm0._4_4_ = pRnm0._4_4_ + -1) {
          pRVar4 = Rnm_ManObj(p,pObj,pRnm0._4_4_);
          if (((uint)*pRVar4 >> 1 & 1) == 0) {
            Rnm_ManJustifyPropFanout_rec(p,pObj,pRnm0._4_4_,vSelect);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Rnm_ManJustify_rec( Rnm_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect )
{ 
    Rnm_Obj_t * pRnm = Rnm_ManObj( p, pObj, f );
    int i;//, Id = Gia_ObjId(p->pGia, pObj);
    if ( pRnm->fVisit )
        return;
    if ( p->fPropFanout )
        Rnm_ManJustifyPropFanout_rec( p, pObj, f, vSelect );
    else
    {
        pRnm->fVisit = 1;
        if ( Rnm_ManObj( p, pObj, 0 )->fVisitJ == 0 )
        {
            Rnm_ManObj( p, pObj, 0 )->fVisitJ = 1;
            p->nVisited++;
        }
    }
    if ( pRnm->fPPi )
    {
        assert( (int)pRnm->Prio > 0 );
        if ( p->fPropFanout )
        {
            for ( i = p->pCex->iFrame; i >= 0; i-- )
                if ( !Rnm_ManObj(p, pObj, i)->fVisit )
                    Rnm_ManJustifyPropFanout_rec( p, pObj, i, vSelect );
        }
        else
        {
            Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
//            for ( i = p->pCex->iFrame; i >= 0; i-- )
//                Rnm_ManObj(p, pObj, i)->fVisit = 1;
        }
        return;
    }
    if ( Gia_ObjIsPi(p->pGia, pObj) || Gia_ObjIsConst0(pObj) )
        return;
    if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        if ( f > 0 )
            Rnm_ManJustify_rec( p, Gia_ObjFanin0(Gia_ObjRoToRi(p->pGia, pObj)), f-1, vSelect );
        return;
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        Rnm_Obj_t * pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pObj), f );
        Rnm_Obj_t * pRnm1 = Rnm_ManObj( p, Gia_ObjFanin1(pObj), f );
        if ( pRnm->Value == 1 )
        {
            if ( pRnm0->Prio > 0 )
                Rnm_ManJustify_rec( p, Gia_ObjFanin0(pObj), f, vSelect );
            if ( pRnm1->Prio > 0 )
                Rnm_ManJustify_rec( p, Gia_ObjFanin1(pObj), f, vSelect );
        }
        else // select one value
        {
            if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRnm1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRnm0->Prio <= pRnm1->Prio ) // choice
                {
                    if ( pRnm0->Prio > 0 )
                        Rnm_ManJustify_rec( p, Gia_ObjFanin0(pObj), f, vSelect );
                }
                else
                {
                    if ( pRnm1->Prio > 0 )
                        Rnm_ManJustify_rec( p, Gia_ObjFanin1(pObj), f, vSelect );
                }
            }
            else if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
            {
                if ( pRnm0->Prio > 0 )
                    Rnm_ManJustify_rec( p, Gia_ObjFanin0(pObj), f, vSelect );
            }
            else if ( (pRnm1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRnm1->Prio > 0 )
                    Rnm_ManJustify_rec( p, Gia_ObjFanin1(pObj), f, vSelect );
            }
            else assert( 0 );
        }
    }
    else assert( 0 );
}